

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_struct<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  size_t sVar1;
  string_view sVar2;
  string_view local_40;
  
  local_40._len = 0;
  if (tag._len != 0) {
    local_40._len = tag._len - 1;
  }
  local_40._ptr = tag._ptr;
  sVar2 = remove_prefix_before(&local_40,'`');
  if (local_40._len == 0) {
    local_40 = resolve_recursive_tag(full_tag,sVar2);
  }
  sVar1 = local_40._len;
  while (sVar1 != 0) {
    tag_pop_label(&local_40);
    sVar2 = tag_pop(&local_40);
    visit_impl<Visitor,std::ifstream>(full_tag,sVar2,visitor,istream,max_recursion);
    sVar1 = local_40._len;
  }
  return;
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}